

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O3

void __thiscall pzgeom::TPZArc3D::ComputeAtributes(TPZArc3D *this,TPZFMatrix<double> *coord)

{
  long lVar1;
  double *pdVar2;
  int64_t iVar3;
  int64_t iVar4;
  int i_1;
  int i;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double Yb;
  double Xb;
  double Ya;
  double Xa;
  TPZVec<double> Temp;
  TPZFNMatrix<9,_double> IBaseCnCP;
  TPZFNMatrix<9,_double> NotUsedHere;
  double local_398;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  TPZVec<double> local_2f0;
  TPZFMatrix<double> local_2d0;
  double local_240 [10];
  TPZFMatrix<double> local_1f0;
  double local_160 [10];
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  local_2d0.fElem = local_240;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_2d0.fSize = 9;
  local_2d0.fGiven = local_2d0.fElem;
  TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
  local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
  local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2d0.fWork.fStore = (double *)0x0;
  local_2d0.fWork.fNElements = 0;
  local_2d0.fWork.fNAlloc = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_2d0,0.0);
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  TPZFMatrix<double>::Resize(&(this->fIBaseCn).super_TPZFMatrix<double>,3,3);
  TPZFMatrix<double>::Resize(&(this->fICnBase).super_TPZFMatrix<double>,3,3);
  TPZManVector<double,_3>::Resize(&this->fCenter3D,3);
  iVar4 = local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  iVar3 = local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  lVar5 = 0;
  do {
    lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar6 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar6 < 1 || lVar1 <= lVar5) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar1 <= lVar5) || (lVar6 < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
       (local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_2d0.fElem[lVar5] = coord->fElem[lVar5] - coord->fElem[lVar1 * 2 + lVar5];
    lVar6 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar6 < 2 || lVar1 <= lVar5) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar1 <= lVar5) || (lVar6 < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
       (local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_2d0.fElem[local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar5] =
         coord->fElem[lVar1 + lVar5] - coord->fElem[lVar1 * 2 + lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar1 < 2 || lVar5 < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = coord->fElem;
  if (lVar1 < 1 || lVar5 < 3) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 2) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 2) || (lVar1 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 2) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 2) || (lVar1 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 2) || (lVar1 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_2d0.fElem[local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] =
       pdVar2[lVar5 + 1] * pdVar2[lVar5 * 2 + 2] +
       (((pdVar2[1] * pdVar2[lVar5 + 2] +
         -pdVar2[lVar5 + 1] * pdVar2[2] + pdVar2[lVar5 * 2 + 1] * pdVar2[2]) -
        pdVar2[lVar5 * 2 + 1] * pdVar2[lVar5 + 2]) - pdVar2[1] * pdVar2[lVar5 * 2 + 2]);
  lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar1 < 2 || lVar5 < 1) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = coord->fElem;
  if (lVar1 < 1 || lVar5 < 3) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 1) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 1) || (lVar1 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 1) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 1) || (lVar1 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 1) || (lVar1 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 3) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_2d0.fElem[local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] =
       (*pdVar2 * pdVar2[lVar5 * 2 + 2] +
       pdVar2[lVar5 * 2] * pdVar2[lVar5 + 2] +
       ((pdVar2[lVar5] * pdVar2[2] - pdVar2[lVar5 * 2] * pdVar2[2]) - *pdVar2 * pdVar2[lVar5 + 2]))
       - pdVar2[lVar5] * pdVar2[lVar5 * 2 + 2];
  lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar1 < 2 || lVar5 < 1) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = coord->fElem;
  if (lVar1 < 1 || lVar5 < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar5 < 1) || (lVar1 < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((1 < lVar5) && (0 < lVar1)) {
    if ((lVar5 < 1) || (lVar1 < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 2) || (lVar1 < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 1) || (lVar1 < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 2) || (lVar1 < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 1) || (lVar1 < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 2) || (lVar1 < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 < 1) || (lVar1 < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((1 < lVar5) && (2 < lVar1)) {
      if (local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3 ||
          local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_2d0.fElem[local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 2] =
           pdVar2[lVar5] * pdVar2[lVar5 * 2 + 1] +
           (((*pdVar2 * pdVar2[lVar5 + 1] +
             -pdVar2[lVar5] * pdVar2[1] + pdVar2[lVar5 * 2] * pdVar2[1]) -
            pdVar2[lVar5 * 2] * pdVar2[lVar5 + 1]) - *pdVar2 * pdVar2[lVar5 * 2 + 1]);
      local_1f0.fElem = local_160;
      local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
           local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
      local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
           local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
      local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_01816238;
      local_1f0.fSize = 9;
      local_1f0.fGiven = local_1f0.fElem;
      TPZVec<int>::TPZVec(&local_1f0.fPivot.super_TPZVec<int>,0);
      local_1f0.fPivot.super_TPZVec<int>.fStore = local_1f0.fPivot.fExtAlloc;
      local_1f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_1f0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_1f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_1f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_1f0.fWork.fStore = (double *)0x0;
      local_1f0.fWork.fNElements = 0;
      local_1f0.fWork.fNAlloc = 0;
      uVar7 = iVar4 * iVar3;
      if (uVar7 == 0) {
        local_1f0.fElem = (double *)0x0;
      }
      else if (9 < (long)uVar7) {
        local_1f0.fElem = (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      }
      local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_01815f48;
      TPZFMatrix<double>::GramSchmidt(&local_2d0,&local_1f0,&local_110);
      TPZFMatrix<double>::operator=(&(this->fIBaseCn).super_TPZFMatrix<double>,&local_1f0);
      TPZFMatrix<double>::Transpose(&local_1f0,(TPZMatrix<double> *)&this->fICnBase);
      ComputeR2Points(this,coord,&local_2f8,&local_300,&local_308,&local_310);
      this->fXcenter = local_2f8 * 0.5;
      this->fYcenter =
           (local_310 * local_310 + (local_308 * local_308 - local_2f8 * local_308)) /
           (local_310 + local_310);
      local_318 = 0.0;
      TPZVec<double>::TPZVec(&local_2f0,3,&local_318);
      *local_2f0.fStore = this->fXcenter;
      local_2f0.fStore[1] = this->fYcenter;
      local_2f0.fStore[2] = 0.0;
      lVar5 = 0;
      while( true ) {
        lVar1 = (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                super_TPZBaseMatrix.fRow;
        local_398 = 0.0;
        lVar6 = 0;
        do {
          if ((lVar1 <= lVar5) ||
             ((this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_398 = local_398 +
                      (this->fIBaseCn).super_TPZFMatrix<double>.fElem[lVar1 * lVar6 + lVar5] *
                      local_2f0.fStore[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar5) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3))
        break;
        (this->fCenter3D).super_TPZVec<double>.fStore[lVar5] =
             local_398 + coord->fElem[lVar1 * 2 + lVar5];
        lVar5 = lVar5 + 1;
        if (lVar5 == 3) {
          this->fRadius = SQRT(this->fXcenter * this->fXcenter + this->fYcenter * this->fYcenter);
          local_318 = 0.0;
          TPZManVector<double,_3>::Resize(&this->finitialVector,2,&local_318);
          pdVar2 = (this->finitialVector).super_TPZVec<double>.fStore;
          *pdVar2 = local_2f8 - this->fXcenter;
          pdVar2[1] = local_300 - this->fYcenter;
          local_2f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_2f0.fStore != (REAL *)0x0) {
            operator_delete__(local_2f0.fStore);
          }
          TPZFMatrix<double>::~TPZFMatrix(&local_1f0,&PTR_PTR_01816200);
          TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_01816200);
          TPZFMatrix<double>::~TPZFMatrix(&local_2d0,&PTR_PTR_01816200);
          return;
        }
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZArc3D::ComputeAtributes(TPZFMatrix<REAL> &coord)
{
#ifdef PZDEBUG
	/** Cross[(mid-ini),(fin-ini)] */
	double CrossX, CrossY, CrossZ;
	try
	{
		CrossX = fabs(-(coord(1,1)*coord(2,0)) + coord(1,2)*coord(2,0) + coord(1,0)*coord(2,1) - coord(1,2)*coord(2,1) - coord(1,0)*coord(2,2) + coord(1,1)*coord(2,2));
		CrossY = fabs(coord(0,1)*coord(2,0) - coord(0,2)*coord(2,0) - coord(0,0)*coord(2,1) + coord(0,2)*coord(2,1) + coord(0,0)*coord(2,2) - coord(0,1)*coord(2,2));
		CrossZ = fabs(-(coord(0,1)*coord(1,0)) + coord(0,2)*coord(1,0) + coord(0,0)*coord(1,1) - coord(0,2)*coord(1,1) - coord(0,0)*coord(1,2) + coord(0,1)*coord(1,2));	
	}
	catch(...){
		std::cout << "Arc3D element with nodes coordinates non initialized!!!\n";
		DebugStop();
	}
	
	/** If Cross[(mid-ini),(fin-ini)] == 0, than the 3 given points are co-linear */
	if(CrossX <= 1.E-6 && CrossY <= 1.E-6 && CrossZ <= 1.E-6)
	{
		cout << "The 3 given points that define an TPZArc3D are co-linear!\n";
		cout << "Method aborted!";
		
		DebugStop();
	}
#endif
	
	/** fIBaseCn -> Basis Change Matrix: from Base(R2) to Canonic(R3) | fIBaseCn 1st column = BaseX | fIBaseCn 2nd column = BaseY */
	TPZFNMatrix<9> IBaseCnCP(3,3,0.), NotUsedHere(3,3,0.);
	fIBaseCn.Resize(3,3); fICnBase.Resize(3,3); fCenter3D.Resize(3);
	for(int i = 0; i < 3; i++)
	{
		IBaseCnCP(i,0) = coord(i,0) - coord(i,2);
		IBaseCnCP(i,1) = coord(i,1) - coord(i,2);
	}
	
	/** fIBaseCn 3rd column = BaseZ = Cross[BaseX,BaseY] |  */
	IBaseCnCP(0,2) = -coord(1,1)*coord(2,0) + coord(1,2)*coord(2,0) + coord(1,0)*coord(2,1) - coord(1,2)*coord(2,1) - coord(1,0)*coord(2,2) + coord(1,1)*coord(2,2);
	IBaseCnCP(1,2) =  coord(0,1)*coord(2,0) - coord(0,2)*coord(2,0) - coord(0,0)*coord(2,1) + coord(0,2)*coord(2,1) + coord(0,0)*coord(2,2) - coord(0,1)*coord(2,2);
	IBaseCnCP(2,2) = -coord(0,1)*coord(1,0) + coord(0,2)*coord(1,0) + coord(0,0)*coord(1,1) - coord(0,2)*coord(1,1) - coord(0,0)*coord(1,2) + coord(0,1)*coord(1,2);
	
	TPZFNMatrix<9> axest(IBaseCnCP.Rows(),IBaseCnCP.Cols());
	IBaseCnCP.GramSchmidt(axest,NotUsedHere);
	
	fIBaseCn = axest;
	axest.Transpose(&fICnBase);
	
	/** fICnBase -> Basis Change Matrix: from Canonic(R3) to Base(R2) | fICnBase(i,0) = Inverse[fIBaseCn] */
	//	fIBaseCn = fICnBase; fIBaseCn.Transpose();
	
	double Xa, Ya, Xb, Yb;
	ComputeR2Points(coord,Xa,Ya,Xb,Yb);
	
	/** Computing the Center Coordinates in R2 base */
	fXcenter = Xa/2.;
	fYcenter = (-Xa*Xb + Xb*Xb + Yb*Yb) / (2.*Yb);
	
	/** Computing the Center Coordinates in R3 base */
	TPZVec<REAL> Temp(3,0.);
	Temp[0] = fXcenter; Temp[1] = fYcenter; Temp[2] = 0.; double temp = 0.;
	for(int i = 0; i < 3; i++)
	{
		for(int j = 0; j < 3; j++) temp += fIBaseCn(i,j)*Temp[j];
		fCenter3D[i] = temp + coord(i,2);
		temp = 0.;
	}
	
	/** Computing Radius */
	fRadius = sqrt( fXcenter*fXcenter + fYcenter*fYcenter );
	
	/** Computing (Center->First_Point) vector */
	finitialVector.Resize(2,0.);
	finitialVector[0] = Xa - fXcenter; finitialVector[1] = Ya - fYcenter;
    
    
    
#ifdef PZDEBUG2
    
    TPZFNMatrix<9,REAL> nodes=coord;
    TPZManVector<REAL,1> loc(1,0.0);
    TPZManVector<REAL,3> result(3.);
    
    REAL resultlocminus1, resultloc0,resultlocplus1;
    
    loc[0] = -1.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,0);
    }
    resultlocminus1 = Norm(result);
    
    //cout << result << endl;
    
    loc[0] = 1.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,1);
    }
    resultlocplus1 = Norm(result);
    
    //cout << result << endl;
    loc[0] = 0.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,2);
    }
    resultloc0 = Norm(result);
    //cout << result << endl;

    
    // testes
    /** If result* !=0 , o ponto mapeados e diferente da coordenada recebida  */
    if(resultlocminus1 >= 1.E-6 ) // loc = -1 ponto da esquerda do arco
    {
        cout << "Method aborted!";
        
        DebugStop();
    }
    if(resultlocplus1 >= 1.E-6) // loc = 1 ponto da direita do arco
    {
        cout << "Method aborted!";
        
        DebugStop();
    }
    if(resultloc0 >= 1.E-6) // loc = 0 ponto do centro do arco
    {

        cout << "Method aborted!";
        
        DebugStop();
    }
#endif
    
}